

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O2

void __thiscall Expr::emitjumps(Expr *this,string *test,int t,int f)

{
  ostream *poVar1;
  string *s;
  stringstream ss;
  string sStack_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  long local_1b8 [2];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  if (f == 0 || t == 0) {
    if (t == 0) {
      if (f == 0) goto LAB_0010990a;
      poVar1 = std::operator<<(local_1a8,"iffalse ");
      poVar1 = std::operator<<(poVar1,(string *)test);
      poVar1 = std::operator<<(poVar1," goto L");
      std::ostream::operator<<(poVar1,f);
      s = &local_218;
      std::__cxx11::stringbuf::str();
      Node::emit(&this->super_Node,s);
    }
    else {
      poVar1 = std::operator<<(local_1a8,"if ");
      poVar1 = std::operator<<(poVar1,(string *)test);
      poVar1 = std::operator<<(poVar1," goto L");
      std::ostream::operator<<(poVar1,t);
      s = &local_1f8;
      std::__cxx11::stringbuf::str();
      Node::emit(&this->super_Node,s);
    }
  }
  else {
    poVar1 = std::operator<<(local_1a8,"if ");
    poVar1 = std::operator<<(poVar1,(string *)test);
    poVar1 = std::operator<<(poVar1," goto L");
    std::ostream::operator<<(poVar1,t);
    std::__cxx11::stringbuf::str();
    Node::emit(&this->super_Node,&sStack_238);
    std::__cxx11::string::~string((string *)&sStack_238);
    std::ios::clear((int)(stringstream *)local_1b8 + (int)*(undefined8 *)(local_1b8[0] + -0x18));
    poVar1 = std::operator<<(local_1a8,"goto L");
    std::ostream::operator<<(poVar1,f);
    s = &local_1d8;
    std::__cxx11::stringbuf::str();
    Node::emit(&this->super_Node,s);
  }
  std::__cxx11::string::~string((string *)s);
LAB_0010990a:
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  return;
}

Assistant:

virtual void emitjumps(std::string test, int t, int f) {
		std::stringstream ss;

		if (t != 0 && f != 0) {
			ss << "if " << test << " goto L" << t;
			emit(ss.str());
			ss.clear();
			ss << "goto L" << f;
			emit(ss.str());
		}
		else if (t != 0) {
			ss << "if " << test << " goto L" << t;
			emit(ss.str());
		}
		else if (f != 0) {
			ss << "iffalse " << test << " goto L" << f;
			emit(ss.str());
		}
	}